

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.cpp
# Opt level: O3

void __thiscall cppurses::Terminal::ncurses_set_palette(Terminal *this,Palette *colors)

{
  short sVar1;
  char cVar2;
  int iVar3;
  long lVar4;
  
  if ((this->is_initialized_ == true) && (cVar2 = can_change_color(), cVar2 != '\0')) {
    lVar4 = 0;
    iVar3 = _COLORS;
    do {
      sVar1 = *(short *)((long)&colors->_M_elems[0].color + lVar4);
      if ((int)sVar1 < (int)((uint)(byte)(0xf < iVar3 & this->is_initialized_) * 8 + 8)) {
        init_color((int)sVar1,
                   (int)(short)(int)(((double)(int)*(short *)((long)&colors->_M_elems[0].values.red
                                                             + lVar4) / 255.0) * 1000.0),
                   (int)(short)(int)(((double)(int)*(short *)((long)&colors->_M_elems[0].values.
                                                                     green + lVar4) / 255.0) *
                                    1000.0),
                   (int)(short)(int)(((double)(int)*(short *)((long)&colors->_M_elems[0].values.blue
                                                             + lVar4) / 255.0) * 1000.0));
        iVar3 = _COLORS;
      }
      lVar4 = lVar4 + 8;
    } while (lVar4 != 0x80);
  }
  return;
}

Assistant:

bool Terminal::can_change_colors() const
{
    if (is_initialized_)
        return ::can_change_color() == TRUE;
    return false;
}